

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O3

void __thiscall
beagle::cpu::EigenDecompositionCube<float,_1>::setEigenDecomposition
          (EigenDecompositionCube<float,_1> *this,int eigenIndex,double *inEigenVectors,
          double *inInverseEigenVectors,double *inEigenValues)

{
  double dVar1;
  uint uVar2;
  float *pfVar3;
  float *pfVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  int j;
  ulong uVar11;
  int iVar12;
  
  uVar2 = (this->super_EigenDecomposition<float,_1>).kStateCount;
  uVar5 = (ulong)uVar2;
  if (((this->super_EigenDecomposition<float,_1>).kFlags & 0x100000) == 0) {
    if (0 < (int)uVar2) {
      uVar9 = 0;
      lVar7 = 0;
      pfVar3 = (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex];
      do {
        uVar11 = 0;
        pfVar3[uVar9] = (float)inEigenValues[uVar9];
        pfVar4 = this->gCMatrices[eigenIndex];
        pdVar6 = inInverseEigenVectors;
        do {
          iVar12 = (int)lVar7;
          uVar8 = 0;
          do {
            pfVar4[(long)iVar12 + uVar8] = (float)(inEigenVectors[uVar8] * pdVar6[uVar8]);
            uVar8 = uVar8 + 1;
          } while (uVar5 != uVar8);
          uVar11 = uVar11 + 1;
          lVar7 = (long)iVar12 + uVar8;
          pdVar6 = pdVar6 + uVar5;
        } while (uVar11 != uVar5);
        uVar9 = uVar9 + 1;
        inEigenVectors = inEigenVectors + uVar5;
        lVar7 = (long)iVar12 + uVar8;
      } while (uVar9 != uVar5);
    }
  }
  else if (0 < (int)uVar2) {
    uVar9 = 0;
    lVar7 = 0;
    pfVar3 = (this->super_EigenDecomposition<float,_1>).gEigenValues[eigenIndex];
    do {
      uVar11 = 0;
      pfVar3[uVar9] = (float)inEigenValues[uVar9];
      pfVar4 = this->gCMatrices[eigenIndex];
      pdVar6 = inInverseEigenVectors;
      do {
        iVar12 = (int)lVar7;
        uVar8 = 0;
        pdVar10 = pdVar6;
        do {
          dVar1 = *pdVar10;
          pdVar10 = pdVar10 + uVar5;
          pfVar4[(long)iVar12 + uVar8] = (float)(inEigenVectors[uVar8] * dVar1);
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
        uVar11 = uVar11 + 1;
        lVar7 = (long)iVar12 + uVar8;
        pdVar6 = pdVar6 + 1;
      } while (uVar11 != uVar5);
      uVar9 = uVar9 + 1;
      inEigenVectors = inEigenVectors + uVar5;
      lVar7 = (long)iVar12 + uVar8;
    } while (uVar9 != uVar5);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::setEigenDecomposition(int eigenIndex,
										           const double* inEigenVectors,
                                                   const double* inInverseEigenVectors,
                                                   const double* inEigenValues) {

    if (kFlags & BEAGLE_FLAG_INVEVEC_STANDARD) {
        int l = 0;
        for (int i = 0; i < kStateCount; i++) {
            gEigenValues[eigenIndex][i] = inEigenValues[i];
            for (int j = 0; j < kStateCount; j++) {
                for (int k = 0; k < kStateCount; k++) {
                    gCMatrices[eigenIndex][l] = inEigenVectors[(i * kStateCount) + k]
                            * inInverseEigenVectors[(k * kStateCount) + j];
                    l++;
                }
            }
        }
    } else {
        int l = 0;
        for (int i = 0; i < kStateCount; i++) {
            gEigenValues[eigenIndex][i] = inEigenValues[i];
            for (int j = 0; j < kStateCount; j++) {
                for (int k = 0; k < kStateCount; k++) {
                    gCMatrices[eigenIndex][l] = inEigenVectors[(i * kStateCount) + k]
                    * inInverseEigenVectors[k + (j*kStateCount)];
                    l++;
                }
            }
        }
    }

}